

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Vec_Int_t *
Iso_ManFindMapping(Aig_Man_t *pAig1,Aig_Man_t *pAig2,Vec_Int_t *vPerm1_,Vec_Int_t *vPerm2_,
                  int fVerbose)

{
  Aig_Man_t *p;
  int iVar1;
  int iVar2;
  Vec_Int_t *local_80;
  Vec_Int_t *local_78;
  int local_54;
  int Entry;
  int i;
  Vec_Int_t *vInvPerm2;
  Vec_Int_t *vPerm2;
  Vec_Int_t *vPerm1;
  Vec_Int_t *pVStack_30;
  int fVerbose_local;
  Vec_Int_t *vPerm2__local;
  Vec_Int_t *vPerm1__local;
  Aig_Man_t *pAig2_local;
  Aig_Man_t *pAig1_local;
  
  vPerm1._4_4_ = fVerbose;
  pVStack_30 = vPerm2_;
  vPerm2__local = vPerm1_;
  vPerm1__local = (Vec_Int_t *)pAig2;
  pAig2_local = pAig1;
  iVar1 = Aig_ManCiNum(pAig1);
  iVar2 = Aig_ManCiNum((Aig_Man_t *)vPerm1__local);
  if (iVar1 == iVar2) {
    iVar1 = Aig_ManCoNum(pAig2_local);
    iVar2 = Aig_ManCoNum((Aig_Man_t *)vPerm1__local);
    if (iVar1 == iVar2) {
      iVar1 = Aig_ManRegNum(pAig2_local);
      iVar2 = Aig_ManRegNum((Aig_Man_t *)vPerm1__local);
      if (iVar1 == iVar2) {
        iVar1 = Aig_ManNodeNum(pAig2_local);
        iVar2 = Aig_ManNodeNum((Aig_Man_t *)vPerm1__local);
        if (iVar1 == iVar2) {
          iVar1 = Aig_ManLevelNum(pAig2_local);
          iVar2 = Aig_ManLevelNum((Aig_Man_t *)vPerm1__local);
          if (iVar1 == iVar2) {
            if (vPerm1._4_4_ != 0) {
              printf("AIG1:\n");
            }
            if (vPerm2__local == (Vec_Int_t *)0x0) {
              local_78 = Saig_ManFindIsoPerm(pAig2_local,vPerm1._4_4_);
            }
            else {
              local_78 = vPerm2__local;
            }
            vPerm2 = local_78;
            if (vPerm1._4_4_ != 0) {
              printf("AIG1:\n");
            }
            if (pVStack_30 == (Vec_Int_t *)0x0) {
              local_80 = Saig_ManFindIsoPerm((Aig_Man_t *)vPerm1__local,vPerm1._4_4_);
            }
            else {
              local_80 = pVStack_30;
            }
            vInvPerm2 = local_80;
            if (vPerm2__local != (Vec_Int_t *)0x0) {
              iVar1 = Vec_IntSize(vPerm2__local);
              iVar2 = Aig_ManCiNum(pAig2_local);
              if (iVar1 != iVar2) {
                __assert_fail("Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                              ,0x121,
                              "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                             );
              }
            }
            if (pVStack_30 != (Vec_Int_t *)0x0) {
              iVar1 = Vec_IntSize(pVStack_30);
              iVar2 = Aig_ManCiNum((Aig_Man_t *)vPerm1__local);
              if (iVar1 != iVar2) {
                __assert_fail("Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                              ,0x123,
                              "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                             );
              }
            }
            _Entry = (Aig_Man_t *)Vec_IntInvert(vInvPerm2,-1);
            for (local_54 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)_Entry), local_54 < iVar1;
                local_54 = local_54 + 1) {
              iVar1 = Vec_IntEntry((Vec_Int_t *)_Entry,local_54);
              if ((iVar1 < 0) || (iVar2 = Aig_ManCiNum(pAig2_local), p = _Entry, iVar2 <= iVar1)) {
                __assert_fail("Entry >= 0 && Entry < Aig_ManCiNum(pAig1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigIso.c"
                              ,0x129,
                              "Vec_Int_t *Iso_ManFindMapping(Aig_Man_t *, Aig_Man_t *, Vec_Int_t *, Vec_Int_t *, int)"
                             );
              }
              iVar1 = Vec_IntEntry(vPerm2,iVar1);
              Vec_IntWriteEntry((Vec_Int_t *)p,local_54,iVar1);
            }
            if (vPerm2__local == (Vec_Int_t *)0x0) {
              Vec_IntFree(vPerm2);
            }
            if (pVStack_30 == (Vec_Int_t *)0x0) {
              Vec_IntFree(vInvPerm2);
            }
            iVar1 = Iso_ManCheckMapping(pAig2_local,(Aig_Man_t *)vPerm1__local,(Vec_Int_t *)_Entry,
                                        vPerm1._4_4_);
            if (iVar1 == 0) {
              Vec_IntFreeP((Vec_Int_t **)&Entry);
            }
            pAig1_local = _Entry;
          }
          else {
            pAig1_local = (Aig_Man_t *)0x0;
          }
        }
        else {
          pAig1_local = (Aig_Man_t *)0x0;
        }
      }
      else {
        pAig1_local = (Aig_Man_t *)0x0;
      }
    }
    else {
      pAig1_local = (Aig_Man_t *)0x0;
    }
  }
  else {
    pAig1_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Int_t *)pAig1_local;
}

Assistant:

Vec_Int_t * Iso_ManFindMapping( Aig_Man_t * pAig1, Aig_Man_t * pAig2, Vec_Int_t * vPerm1_, Vec_Int_t * vPerm2_, int fVerbose )
{
    Vec_Int_t * vPerm1, * vPerm2, * vInvPerm2;
    int i, Entry;
    if ( Aig_ManCiNum(pAig1) != Aig_ManCiNum(pAig2) )
        return NULL;
    if ( Aig_ManCoNum(pAig1) != Aig_ManCoNum(pAig2) )
        return NULL;
    if ( Aig_ManRegNum(pAig1) != Aig_ManRegNum(pAig2) )
        return NULL;
    if ( Aig_ManNodeNum(pAig1) != Aig_ManNodeNum(pAig2) )
        return NULL;
    if ( Aig_ManLevelNum(pAig1) != Aig_ManLevelNum(pAig2) )
        return NULL;
//    if ( Iso_ManNegEdgeNum(pAig1) != Iso_ManNegEdgeNum(pAig2) )
//        return NULL;
//    s_Counter++;

    if ( fVerbose ) 
        printf( "AIG1:\n" );
    vPerm1 = vPerm1_ ? vPerm1_ : Saig_ManFindIsoPerm( pAig1, fVerbose );
    if ( fVerbose )
        printf( "AIG1:\n" );
    vPerm2 = vPerm2_ ? vPerm2_ : Saig_ManFindIsoPerm( pAig2, fVerbose );
    if ( vPerm1_ )
        assert( Vec_IntSize(vPerm1_) == Aig_ManCiNum(pAig1) );
    if ( vPerm2_ )
        assert( Vec_IntSize(vPerm2_) == Aig_ManCiNum(pAig2) );
    // find canonical permutation
    // vPerm1/vPerm2 give canonical order of CIs of AIG1/AIG2
    vInvPerm2 = Vec_IntInvert( vPerm2, -1 );
    Vec_IntForEachEntry( vInvPerm2, Entry, i )
    {
        assert( Entry >= 0 && Entry < Aig_ManCiNum(pAig1) );
        Vec_IntWriteEntry( vInvPerm2, i, Vec_IntEntry(vPerm1, Entry) );
    }
    if ( vPerm1_ == NULL )
        Vec_IntFree( vPerm1 );
    if ( vPerm2_ == NULL )
        Vec_IntFree( vPerm2 );
    // check if they are indeed equivalent
    if ( !Iso_ManCheckMapping( pAig1, pAig2, vInvPerm2, fVerbose ) )
        Vec_IntFreeP( &vInvPerm2 );
    return vInvPerm2;
}